

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_name_resolver.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::java::ClassNameResolver::GetClassFullName
          (string *__return_storage_ptr__,ClassNameResolver *this,string *name_without_package,
          FileDescriptor *file,bool immutable,bool multiple_files)

{
  ulong uVar1;
  string local_80;
  string local_50;
  undefined1 local_2b;
  byte local_2a;
  byte local_29;
  bool multiple_files_local;
  FileDescriptor *pFStack_28;
  bool immutable_local;
  FileDescriptor *file_local;
  string *name_without_package_local;
  ClassNameResolver *this_local;
  string *result;
  
  local_2b = 0;
  local_2a = multiple_files;
  local_29 = immutable;
  pFStack_28 = file;
  file_local = (FileDescriptor *)name_without_package;
  name_without_package_local = (string *)this;
  this_local = (ClassNameResolver *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  if ((local_2a & 1) == 0) {
    GetClassName_abi_cxx11_(&local_80,this,pFStack_28,(bool)(local_29 & 1));
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_80);
    std::__cxx11::string::~string((string *)&local_80);
  }
  else {
    FileJavaPackage_abi_cxx11_
              (&local_50,(java *)pFStack_28,(FileDescriptor *)(ulong)(local_29 & 1),immutable);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'.');
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)file_local);
  return __return_storage_ptr__;
}

Assistant:

string ClassNameResolver::GetClassFullName(const string& name_without_package,
                                           const FileDescriptor* file,
                                           bool immutable,
                                           bool multiple_files) {
  string result;
  if (multiple_files) {
    result = FileJavaPackage(file, immutable);
  } else {
    result = GetClassName(file, immutable);
  }
  if (!result.empty()) {
    result += '.';
  }
  result += name_without_package;
  return result;
}